

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O0

int Curl_dyn_vprintf(dynbuf *dyn,char *format,__va_list_tag *ap_save)

{
  dynbuf *local_38;
  asprintf info;
  __va_list_tag *ap_save_local;
  char *format_local;
  dynbuf *dyn_local;
  
  info.b._0_1_ = '\0';
  local_38 = dyn;
  info._8_8_ = ap_save;
  formatf(&local_38,alloc_addbyter,format,ap_save);
  if ((char)info.b == '\0') {
    dyn_local._4_4_ = 0;
  }
  else {
    Curl_dyn_free(local_38);
    dyn_local._4_4_ = (int)(char)info.b;
  }
  return dyn_local._4_4_;
}

Assistant:

int Curl_dyn_vprintf(struct dynbuf *dyn, const char *format, va_list ap_save)
{
  struct asprintf info;
  info.b = dyn;
  info.merr = MERR_OK;

  (void)formatf(&info, alloc_addbyter, format, ap_save);
  if(info.merr) {
    Curl_dyn_free(info.b);
    return info.merr;
  }
  return 0;
}